

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_mull_u8_arm(uint32_t a,uint32_t b)

{
  uint8_t tmp_y_3;
  uint8_t tmp_x_3;
  uint8_t tmp_y_2;
  uint8_t tmp_x_2;
  uint8_t tmp_y_1;
  uint8_t tmp_x_1;
  uint8_t tmp_y;
  uint8_t tmp_x;
  uint64_t result;
  uint64_t tmp;
  uint32_t b_local;
  uint32_t a_local;
  
  return CONCAT26((ushort)(byte)(a >> 0x18) * (ushort)(byte)(b >> 0x18),
                  CONCAT24((ushort)(byte)(a >> 0x10) * (ushort)(byte)(b >> 0x10),
                           CONCAT22((ushort)(byte)(a >> 8) * (ushort)(byte)(b >> 8),
                                    (ushort)(byte)a * (ushort)(byte)b)));
}

Assistant:

uint64_t HELPER(neon_mull_u8)(uint32_t a, uint32_t b)
{
    uint64_t tmp;
    uint64_t result;

    DO_MULL(result, a, b, uint8_t, uint16_t);
    DO_MULL(tmp, a >> 8, b >> 8, uint8_t, uint16_t);
    result |= tmp << 16;
    DO_MULL(tmp, a >> 16, b >> 16, uint8_t, uint16_t);
    result |= tmp << 32;
    DO_MULL(tmp, a >> 24, b >> 24, uint8_t, uint16_t);
    result |= tmp << 48;
    return result;
}